

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::findString
                    (QStringView haystack0,qsizetype from,QStringView needle0,CaseSensitivity cs)

{
  char16_t *pcVar1;
  char32_t cVar2;
  int iVar3;
  qsizetype qVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  QtPrivate *this;
  char16_t *pcVar11;
  char16_t *ch;
  long lVar12;
  char16_t *ch_00;
  ulong uVar13;
  bool bVar14;
  QStringView rhs;
  QStringView rhs_00;
  QStringView str;
  
  pcVar11 = needle0.m_data;
  uVar7 = needle0.m_size;
  str.m_size = haystack0.m_data;
  this = (QtPrivate *)haystack0.m_size;
  if (uVar7 == 1) {
    str.m_data = (storage_type_conflict *)from;
    qVar4 = findString(this,str,(ulong)(ushort)*pcVar11,(QChar)(char16_t)cs,cs);
    return qVar4;
  }
  uVar8 = from >> 0x3f & (ulong)this;
  lVar10 = uVar8 + from;
  lVar9 = -1;
  if ((((QtPrivate *)(uVar7 + lVar10) <= this) && (lVar9 = lVar10, uVar7 != 0)) &&
     (lVar9 = -1, this != (QtPrivate *)0x0)) {
    if (5 < (long)uVar7 && 500 < (long)this) {
      qVar4 = qFindStringBoyerMoore(haystack0,lVar10,needle0,cs);
      return qVar4;
    }
    pcVar1 = str.m_size + lVar10;
    uVar13 = 0;
    if (0 < (long)uVar7) {
      uVar13 = uVar7;
    }
    bVar6 = (byte)(uVar7 - 1);
    if (cs == CaseSensitive) {
      lVar9 = 0;
      lVar10 = 0;
      for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
        lVar10 = (ulong)(ushort)pcVar11[uVar5] + lVar10 * 2;
        lVar9 = (ulong)(ushort)pcVar1[uVar5] + lVar9 * 2;
      }
      lVar9 = lVar9 - (ulong)(ushort)pcVar1[uVar7 - 1];
      for (lVar12 = from * 2; pcVar11 = (char16_t *)((long)str.m_size + lVar12 + uVar8 * 2),
          pcVar11 <= str.m_size + ((long)this - uVar7); lVar12 = lVar12 + 2) {
        lVar9 = lVar9 + (ulong)*(ushort *)((long)str.m_size + lVar12 + uVar7 * 2 + uVar8 * 2 + -2);
        if ((lVar9 == lVar10) &&
           (rhs.m_data = pcVar11, rhs.m_size = uVar7,
           iVar3 = compareStrings(needle0,rhs,CaseSensitive), iVar3 == 0)) {
          return (long)(lVar12 + uVar8 * 2) >> 1;
        }
        if (uVar7 < 0x41) {
          lVar9 = lVar9 - ((ulong)(ushort)*pcVar11 << (bVar6 & 0x3f));
        }
        lVar9 = lVar9 * 2;
      }
    }
    else {
      lVar12 = 0;
      lVar9 = 0;
      ch = pcVar1;
      ch_00 = pcVar11;
      while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
        cVar2 = foldCase(ch_00,pcVar11);
        lVar9 = (ulong)(uint)cVar2 + lVar9 * 2;
        cVar2 = foldCase(ch,str.m_size);
        lVar12 = (ulong)(uint)cVar2 + lVar12 * 2;
        ch_00 = ch_00 + 1;
        ch = ch + 1;
      }
      cVar2 = foldCase(pcVar1 + (uVar7 - 1),str.m_size);
      lVar12 = lVar12 - (ulong)(uint)cVar2;
      for (lVar10 = lVar10 * 2; pcVar11 = (char16_t *)((long)str.m_size + lVar10),
          pcVar11 <= str.m_size + ((long)this - uVar7); lVar10 = lVar10 + 2) {
        cVar2 = foldCase((char16_t *)((long)str.m_size + lVar10 + uVar7 * 2 + -2),str.m_size);
        lVar12 = lVar12 + (ulong)(uint)cVar2;
        if ((lVar12 == lVar9) &&
           (rhs_00.m_data = pcVar11, rhs_00.m_size = uVar7,
           iVar3 = compareStrings(needle0,rhs_00,CaseInsensitive), iVar3 == 0)) {
          return lVar10 >> 1;
        }
        if (uVar7 < 0x41) {
          cVar2 = foldCase(pcVar11,str.m_size);
          lVar12 = lVar12 - ((ulong)(uint)cVar2 << (bVar6 & 0x3f));
        }
        lVar12 = lVar12 * 2;
      }
    }
    lVar9 = -1;
  }
  return lVar9;
}

Assistant:

qsizetype QtPrivate::findString(QStringView haystack0, qsizetype from, QStringView needle0, Qt::CaseSensitivity cs) noexcept
{
    const qsizetype l = haystack0.size();
    const qsizetype sl = needle0.size();
    if (sl == 1)
        return findString(haystack0, from, needle0[0], cs);
    if (from < 0)
        from += l;
    if (std::size_t(sl + from) > std::size_t(l))
        return -1;
    if (!sl)
        return from;
    if (!l)
        return -1;

    /*
        We use the Boyer-Moore algorithm in cases where the overhead
        for the skip table should pay off, otherwise we use a simple
        hash function.
    */
    if (l > 500 && sl > 5)
        return qFindStringBoyerMoore(haystack0, from, needle0, cs);

    auto sv = [sl](const char16_t *v) { return QStringView(v, sl); };
    /*
        We use some hashing for efficiency's sake. Instead of
        comparing strings, we compare the hash value of str with that
        of a part of this QString. Only if that matches, we call
        qt_string_compare().
    */
    const char16_t *needle = needle0.utf16();
    const char16_t *haystack = haystack0.utf16() + from;
    const char16_t *end = haystack0.utf16() + (l - sl);
    const qregisteruint sl_minus_1 = sl - 1;
    qregisteruint hashNeedle = 0, hashHaystack = 0;
    qsizetype idx;

    if (cs == Qt::CaseSensitive) {
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = ((hashNeedle<<1) + needle[idx]);
            hashHaystack = ((hashHaystack<<1) + haystack[idx]);
        }
        hashHaystack -= haystack[sl_minus_1];

        while (haystack <= end) {
            hashHaystack += haystack[sl_minus_1];
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseSensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(*haystack);
            ++haystack;
        }
    } else {
        const char16_t *haystack_start = haystack0.utf16();
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = (hashNeedle<<1) + foldCase(needle + idx, needle);
            hashHaystack = (hashHaystack<<1) + foldCase(haystack + idx, haystack_start);
        }
        hashHaystack -= foldCase(haystack + sl_minus_1, haystack_start);

        while (haystack <= end) {
            hashHaystack += foldCase(haystack + sl_minus_1, haystack_start);
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseInsensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(foldCase(haystack, haystack_start));
            ++haystack;
        }
    }
    return -1;
}